

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O1

void __thiscall
serialize_tests::OtherParamChecker::
Unserialize<ParamsStream<ParamsStream<ParamsStream<ParamsStream<DataStream&,serialize_tests::OtherParam>,serialize_tests::OtherParam>,serialize_tests::BaseFormat>&,serialize_tests::OtherParam>>
          (OtherParamChecker *this,
          ParamsStream<ParamsStream<ParamsStream<ParamsStream<DataStream_&,_serialize_tests::OtherParam>,_serialize_tests::OtherParam>,_serialize_tests::BaseFormat>_&,_serialize_tests::OtherParam>
          *s)

{
  size_t in_RCX;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  lazy_ostream local_e8;
  undefined1 *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  uint8_t local_a2;
  uint8_t param;
  uint8_t *local_a0;
  undefined **local_98;
  undefined1 local_90;
  undefined1 *local_88;
  uint8_t **local_80;
  uint8_t *local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined1 *local_60;
  uint8_t **local_58;
  char *local_50;
  char *local_48;
  assertion_result local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  param = s->m_params->param;
  DataStream::read((s->m_substream->m_substream).m_substream.m_substream,(int)&local_a2,(void *)0x1,
                   in_RCX);
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x17f;
  file.m_begin = (iterator)&local_b8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c8,msg);
  local_e8.m_empty = false;
  local_e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  local_40.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a2 == param);
  local_40.m_message.px = (element_type *)0x0;
  local_40.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_48 = "";
  local_58 = &local_78;
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_013d4aa0;
  local_60 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_a0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013d4aa0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_a0 = &param;
  local_78 = &local_a2;
  boost::test_tools::tt_detail::report_assertion
            (&local_40,&local_e8,1,2,REQUIRE,0xe779b5,(size_t)&local_50,0x17f,&local_70,"param",
             &local_98);
  boost::detail::shared_count::~shared_count(&local_40.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s) const
    {
        const uint8_t param = s.template GetParams<OtherParam>().param;
        uint8_t value;
        s >> value;
        BOOST_CHECK_EQUAL(value, param);
    }